

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.cpp
# Opt level: O0

int GetNumAlphaCharsInString(string *my_str)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 local_18;
  undefined4 local_14;
  int i;
  int alphaCount;
  string *my_str_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_18) break;
    pcVar3 = (char *)std::__cxx11::string::at((ulong)my_str);
    iVar1 = isalpha((int)*pcVar3);
    if (iVar1 != 0) {
      local_14 = local_14 + 1;
    }
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int GetNumAlphaCharsInString(string *my_str)
{
    //Use is alpha function to find alpha chars.
    int alphaCount = 0;

    for(int i = 0; i < my_str->length(); i++)
    {

        if(isalpha(my_str->at(i)))
        {
            alphaCount++;
        }
    }

    return alphaCount;
}